

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

Vec_Ptr_t * Aig_ManDfsChoices(Aig_Man_t *p)

{
  void *pvVar1;
  Vec_Ptr_t *vNodes;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < p->vObjs->nSize; iVar2 = iVar2 + 1) {
    Vec_PtrEntry(p->vObjs,iVar2);
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    Aig_ManIncrementTravId(p);
    p->pConst1->TravId = p->nTravIds;
    for (iVar2 = 0; iVar2 < p->vCis->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(p->vCis,iVar2);
      *(int *)((long)pvVar1 + 0x20) = p->nTravIds;
    }
    vNodes = Vec_PtrAlloc(p->nObjs[6] + p->nObjs[5]);
    for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(p->vCos,iVar2);
      Aig_ManDfsChoices_rec
                (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),vNodes);
    }
    return vNodes;
  }
  __assert_fail("p->pEquivs != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                ,0x198,"Vec_Ptr_t *Aig_ManDfsChoices(Aig_Man_t *)");
}

Assistant:

Vec_Ptr_t * Aig_ManDfsChoices( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i, Counter = 0;

    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Aig_ObjEquiv(p, pObj) == NULL )
            continue;
        Counter = 0;
        for ( pObj = Aig_ObjEquiv(p, pObj) ; pObj; pObj = Aig_ObjEquiv(p, pObj) )
            Counter++;
//        printf( "%d ", Counter );
    }
//    printf( "\n" );

    assert( p->pEquivs != NULL );
    Aig_ManIncrementTravId( p );
    // mark constant and PIs
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Aig_ManForEachCi( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // go through the nodes
    vNodes = Vec_PtrAlloc( Aig_ManNodeNum(p) );
    Aig_ManForEachCo( p, pObj, i )
        Aig_ManDfsChoices_rec( p, Aig_ObjFanin0(pObj), vNodes );
    return vNodes;
}